

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-test.c++
# Opt level: O2

void kj::(anonymous_namespace)::expectRes<kj::Array<unsigned_char>,4ul>
               (EncodingResult<kj::Array<unsigned_char>_> *result,byte (*expected) [4],bool errors)

{
  undefined7 in_register_00000011;
  unsigned_long uVar1;
  unsigned_long uVar2;
  CappedArray<char,_3UL> CVar3;
  unsigned_long i;
  CappedArray<char,_3UL> local_70;
  CappedArray<char,_3UL> local_60;
  Array<unsigned_char> local_50;
  byte local_38;
  
  local_50.ptr = (result->super_Array<unsigned_char>).ptr;
  local_50.size_ = (result->super_Array<unsigned_char>).size_;
  local_50.disposer = (result->super_Array<unsigned_char>).disposer;
  (result->super_Array<unsigned_char>).ptr = (uchar *)0x0;
  (result->super_Array<unsigned_char>).size_ = 0;
  local_38 = result->hadErrors;
  if ((int)CONCAT71(in_register_00000011,errors) == 0) {
    if ((local_38 & _::Debug::minSeverity < 3) == 1) {
      _::Debug::log<char_const(&)[35]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/encoding-test.c++"
                 ,0x2d,ERROR,"\"failed: expected \" \"!result.hadErrors\"",
                 (char (*) [35])"failed: expected !result.hadErrors");
    }
  }
  else if ((bool)local_38 == false && _::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[34]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/encoding-test.c++"
               ,0x2b,ERROR,"\"failed: expected \" \"result.hadErrors\"",
               (char (*) [34])"failed: expected result.hadErrors");
  }
  if ((local_50.size_ != 4) && (_::Debug::minSeverity < 3)) {
    local_60.currentSize = local_50.size_;
    local_70.currentSize = 4;
    _::Debug::log<char_const(&)[50],unsigned_long,unsigned_long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/encoding-test.c++"
               ,0x30,ERROR,
               "\"failed: expected \" \"result.size() == expected.size()\", result.size(), expected.size()"
               ,(char (*) [50])"failed: expected result.size() == expected.size()",
               &local_60.currentSize,&local_70.currentSize);
  }
  uVar2 = 4;
  if (local_50.size_ < 4) {
    uVar2 = local_50.size_;
  }
  for (uVar1 = 0; uVar2 != uVar1; uVar1 = uVar1 + 1) {
    i = uVar1;
    if ((local_50.ptr[uVar1] != (*expected)[uVar1]) && (_::Debug::minSeverity < 3)) {
      CVar3 = anon_unknown_0::hex(local_50.ptr[uVar1]);
      local_60.currentSize = CVar3.currentSize;
      local_60.content._0_2_ = CVar3.content._0_2_;
      local_60.content[2] = CVar3.content[2];
      CVar3 = anon_unknown_0::hex((*expected)[i]);
      local_70.currentSize = CVar3.currentSize;
      local_70.content._0_2_ = CVar3.content._0_2_;
      local_70.content[2] = CVar3.content[2];
      _::Debug::
      log<char_const(&)[42],unsigned_long&,kj::CappedArray<char,3ul>,kj::CappedArray<char,3ul>>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/encoding-test.c++"
                 ,0x32,ERROR,
                 "\"failed: expected \" \"result[i] == expected[i]\", i, hex(result[i]), hex(expected[i])"
                 ,(char (*) [42])"failed: expected result[i] == expected[i]",&i,&local_60,&local_70)
      ;
    }
  }
  Array<unsigned_char>::~Array(&local_50);
  return;
}

Assistant:

void expectRes(EncodingResult<T> result,
               byte (&expected)[s],
               bool errors = false) {
  expectResImpl(kj::mv(result), arrayPtr<const byte>(expected, s), errors);
}